

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O2

bool __thiscall libchars::history::next(history *this)

{
  history *phVar1;
  history *phVar2;
  
  if (this[8] == (history)0x1) {
    phVar1 = this + 0x30;
    if (((*(history **)(this + 0x30) != phVar1) && (this[0x50] == (history)0x0)) &&
       (*(history **)(this + 0x48) != phVar1)) {
      phVar2 = *(history **)*(history **)(this + 0x48);
      *(history **)(this + 0x48) = phVar2;
      if (phVar2 == phVar1) {
        this[8] = (history)0x0;
        this[0x50] = (history)0x1;
      }
      return true;
    }
    this[8] = (history)0x0;
  }
  return false;
}

Assistant:

bool history::next()
    {
        if (!busy)
            return false;

        if (lines.empty() || overflow || li == lines.end()) {
            busy = false;
            return false;
        }

        if (++li == lines.end()) {
            busy = false;
            overflow = true;
            // revert back to temporary string
            return true;
        }
        else {
            // use next value
            return true;
        }
    }